

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

void lj_ir_growbot(jit_State *J)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  ulong uVar4;
  long in_RDI;
  MSize ofs_1;
  IRIns *newbase;
  MSize ofs;
  MSize szins;
  IRIns *baseir;
  MSize in_stack_ffffffffffffffc0;
  uint uVar5;
  MSize in_stack_ffffffffffffffc4;
  void *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  pvVar2 = (void *)(*(long *)(in_RDI + 0x100) + (ulong)*(uint *)(in_RDI + 0x10c) * 8);
  uVar1 = *(int *)(in_RDI + 0x108) - *(int *)(in_RDI + 0x10c);
  if (*(int *)(in_RDI + 8) + (uVar1 >> 1) < *(uint *)(in_RDI + 0x108)) {
    uVar1 = uVar1 >> 2;
    memmove((void *)((long)pvVar2 + (ulong)uVar1 * 8),pvVar2,
            (ulong)(uint)(*(int *)(in_RDI + 8) - *(int *)(in_RDI + 0x10c)) << 3);
    *(uint *)(in_RDI + 0x10c) = *(int *)(in_RDI + 0x10c) - uVar1;
    *(uint *)(in_RDI + 0x108) = *(int *)(in_RDI + 0x108) - uVar1;
    pvVar2 = (void *)((long)pvVar2 + (ulong)*(uint *)(in_RDI + 0x10c) * -8);
    *(void **)(in_RDI + 0x100) = pvVar2;
    *(void **)(in_RDI + 0x10) = pvVar2;
  }
  else {
    pvVar3 = lj_mem_realloc((lua_State *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                            in_stack_ffffffffffffffc0);
    if (uVar1 < 0x100) {
      uVar5 = uVar1 >> 1;
    }
    else {
      uVar5 = 0x80;
    }
    memcpy((void *)((long)pvVar3 + (ulong)uVar5 * 8),pvVar2,
           (ulong)(uint)(*(int *)(in_RDI + 8) - *(int *)(in_RDI + 0x10c)) << 3);
    uVar4 = (ulong)*(uint *)(*(long *)(in_RDI + 0x60) + 8);
    *(int *)(uVar4 + 0x20) = *(int *)(uVar4 + 0x20) - (int)((ulong)uVar1 << 3);
    (**(code **)(uVar4 + 0x10))(*(undefined8 *)(uVar4 + 0x18),pvVar2,(ulong)uVar1 << 3,0);
    *(uint *)(in_RDI + 0x10c) = *(int *)(in_RDI + 0x10c) - uVar5;
    *(uint *)(in_RDI + 0x108) = *(int *)(in_RDI + 0x10c) + uVar1 * 2;
    pvVar3 = (void *)((long)pvVar3 + (ulong)*(uint *)(in_RDI + 0x10c) * -8);
    *(void **)(in_RDI + 0x100) = pvVar3;
    *(void **)(in_RDI + 0x10) = pvVar3;
  }
  return;
}

Assistant:

static void lj_ir_growbot(jit_State *J)
{
  IRIns *baseir = J->irbuf + J->irbotlim;
  MSize szins = J->irtoplim - J->irbotlim;
  lua_assert(szins != 0);
  lua_assert(J->cur.nk == J->irbotlim);
  if (J->cur.nins + (szins >> 1) < J->irtoplim) {
    /* More than half of the buffer is free on top: shift up by a quarter. */
    MSize ofs = szins >> 2;
    memmove(baseir + ofs, baseir, (J->cur.nins - J->irbotlim)*sizeof(IRIns));
    J->irbotlim -= ofs;
    J->irtoplim -= ofs;
    J->cur.ir = J->irbuf = baseir - J->irbotlim;
  } else {
    /* Double the buffer size, but split the growth amongst top/bottom. */
    IRIns *newbase = lj_mem_newt(J->L, 2*szins*sizeof(IRIns), IRIns);
    MSize ofs = szins >= 256 ? 128 : (szins >> 1);  /* Limit bottom growth. */
    memcpy(newbase + ofs, baseir, (J->cur.nins - J->irbotlim)*sizeof(IRIns));
    lj_mem_free(G(J->L), baseir, szins*sizeof(IRIns));
    J->irbotlim -= ofs;
    J->irtoplim = J->irbotlim + 2*szins;
    J->cur.ir = J->irbuf = newbase - J->irbotlim;
  }
}